

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O0

bool __thiscall lzham::symbol_codec::record_put_bits(symbol_codec *this,uint bits,uint num_bits)

{
  bool bVar1;
  int in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  output_symbol sym;
  undefined1 local_1;
  
  if (in_EDX == 0) {
    local_1 = true;
  }
  else {
    *(int *)(in_RDI + 0x78) = in_EDX + *(int *)(in_RDI + 0x78);
    bVar1 = vector<lzham::symbol_codec::output_symbol>::try_push_back
                      ((vector<lzham::symbol_codec::output_symbol> *)CONCAT44(in_ESI,in_EDX),
                       (output_symbol *)(ulong)CONCAT24((short)in_EDX,in_ESI));
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool symbol_codec::record_put_bits(uint bits, uint num_bits)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      LZHAM_ASSERT(num_bits <= 25);
      LZHAM_ASSERT(m_bit_count >= 25);

      if (!num_bits)
         return true;

      m_total_bits_written += num_bits;

      output_symbol sym;
      sym.m_bits = bits;
      sym.m_num_bits = (uint16)num_bits;
      sym.m_arith_prob0 = 0;
      if (!m_output_syms.try_push_back(sym))
         return false;

      return true;
   }